

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O2

int Sfm_TimSortArrayByArrival(Sfm_Tim_t *p,Vec_Int_t *vNodes,int iPivot)

{
  word wVar1;
  int iVar2;
  int Id;
  int iVar3;
  word *__ptr;
  int iVar4;
  uint uVar5;
  int nSize;
  ulong uVar6;
  int i;
  ulong uVar7;
  
  iVar2 = Sfm_TimArrMaxId(p,iPivot);
  if (p->DeltaCrit < 1) {
    __assert_fail("p->DeltaCrit > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                  ,0x155,"int Sfm_TimSortArrayByArrival(Sfm_Tim_t *, Vec_Int_t *, int)");
  }
  (p->vSortData).nSize = 0;
  nSize = 0;
  i = 0;
  while( true ) {
    if (vNodes->nSize <= i) {
      Abc_QuickSort3((p->vSortData).pArray,nSize,0);
      vNodes->nSize = 0;
      uVar7 = 0xffffffff;
      for (uVar6 = 0; (long)uVar6 < (long)(p->vSortData).nSize; uVar6 = uVar6 + 1) {
        wVar1 = (p->vSortData).pArray[uVar6];
        Vec_IntPush(vNodes,(int)(wVar1 >> 0x20));
        if (((int)uVar7 == -1) &&
           (uVar7 = 0xffffffff, iVar2 + 500000000 < (int)wVar1 + p->DeltaCrit)) {
          uVar7 = uVar6 & 0xffffffff;
        }
      }
      return (int)uVar7;
    }
    Id = Vec_IntEntry(vNodes,i);
    iVar3 = Sfm_TimArrMaxId(p,Id);
    if (0x3b9ac9fe < iVar3 + 499999999U) break;
    iVar4 = (p->vSortData).nSize;
    if (iVar4 == (p->vSortData).nCap) {
      uVar5 = iVar4 * 2;
      if (iVar4 < 0x10) {
        uVar5 = 0x10;
      }
      __ptr = (p->vSortData).pArray;
      if (iVar4 < (int)uVar5) {
        if (__ptr == (word *)0x0) {
          __ptr = (word *)malloc((ulong)uVar5 << 3);
        }
        else {
          __ptr = (word *)realloc(__ptr,(ulong)uVar5 << 3);
        }
        (p->vSortData).pArray = __ptr;
        if (__ptr == (word *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
        (p->vSortData).nCap = uVar5;
        iVar4 = (p->vSortData).nSize;
      }
    }
    else {
      __ptr = (p->vSortData).pArray;
    }
    nSize = iVar4 + 1;
    (p->vSortData).nSize = nSize;
    __ptr[iVar4] = CONCAT44(Id,iVar3 + 500000000);
    i = i + 1;
  }
  __assert_fail("-ABC_INFINITY/2 < Time && Time < ABC_INFINITY/2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                ,0x15b,"int Sfm_TimSortArrayByArrival(Sfm_Tim_t *, Vec_Int_t *, int)");
}

Assistant:

int Sfm_TimSortArrayByArrival( Sfm_Tim_t * p, Vec_Int_t * vNodes, int iPivot )
{
    word Entry; 
    int i, Id, Time, nDivNew = -1; 
    int MaxDelay = ABC_INFINITY/2+Sfm_TimArrMaxId(p, iPivot);
    assert( p->DeltaCrit > 0 );
    // collect nodes
    Vec_WrdClear( &p->vSortData );
    Vec_IntForEachEntry( vNodes, Id, i )
    {
        Time = Sfm_TimArrMaxId( p, Id );
        assert( -ABC_INFINITY/2 < Time && Time < ABC_INFINITY/2 );
        Vec_WrdPush( &p->vSortData, ((word)Id << 32) | (ABC_INFINITY/2+Time) );
    }
    // sort nodes by delay
    Abc_QuickSort3( Vec_WrdArray(&p->vSortData), Vec_WrdSize(&p->vSortData), 0 );
    // collect sorted nodes and find place where divisors end
    Vec_IntClear( vNodes );
    Vec_WrdForEachEntry( &p->vSortData, Entry, i )
    {
        Vec_IntPush( vNodes, (int)(Entry >> 32) );
        if ( nDivNew == -1 && ((int)Entry) + p->DeltaCrit > MaxDelay )
            nDivNew = i;
    }
    return nDivNew;
}